

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkSkeletonBlifMv(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pAVar6;
  uint uVar7;
  int iVar8;
  Abc_Ntk_t *pNtk_00;
  char *pcVar9;
  Abc_Obj_t *pAVar10;
  int *piVar11;
  void *pvVar12;
  uint *puVar13;
  Abc_Obj_t *pAVar14;
  Abc_Obj_t *pAVar15;
  Abc_Obj_t *pAVar16;
  Vec_Ptr_t *pVVar17;
  int extraout_EDX;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long lVar18;
  long extraout_RDX_07;
  long extraout_RDX_08;
  int iVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2de,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_BLIFMV) {
    __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2df,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2e0,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2e1,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy(pNtk);
  pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pcVar9 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar9;
  pcVar9 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pSpec = pcVar9;
  pAVar10 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_WHITEBOX);
  pVVar17 = pNtk->vPis;
  lVar18 = extraout_RDX;
  if (0 < pVVar17->nSize) {
    lVar20 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar17->pArray[lVar20];
      Abc_NtkDupObj(pNtk_00,pAVar3,0);
      pAVar14 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
      Abc_NtkDupObj(pNtk_00,pAVar14,1);
      Abc_ObjAddFanin((pAVar14->field_6).pCopy,(pAVar3->field_6).pCopy);
      lVar20 = lVar20 + 1;
      pVVar17 = pNtk->vPis;
      lVar18 = extraout_RDX_00;
    } while (lVar20 < pVVar17->nSize);
  }
  pVVar17 = pNtk->vPos;
  if (0 < pVVar17->nSize) {
    lVar20 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar17->pArray[lVar20];
      Abc_NtkDupObj(pNtk_00,pAVar3,0);
      pAVar14 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
      if ((pAVar14->field_6).pTemp == (void *)0x0) {
        Abc_NtkDupObj(pNtk_00,pAVar14,1);
      }
      Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar14->field_6).pCopy);
      lVar20 = lVar20 + 1;
      pVVar17 = pNtk->vPos;
      lVar18 = extraout_RDX_01;
    } while (lVar20 < pVVar17->nSize);
  }
  pVVar17 = pNtk->vBoxes;
  if (0 < pVVar17->nSize) {
    lVar20 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar17->pArray[lVar20];
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        Abc_NtkDupBox(pNtk_00,pAVar3,0);
        plVar4 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
        pAVar14 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
        if ((pAVar14->field_6).pTemp != (void *)0x0) {
          __assert_fail("pNet->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                        ,0x304,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
        }
        Abc_NtkDupObj(pNtk_00,pAVar14,1);
        Abc_ObjAddFanin((pAVar14->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray] + 0x40));
        plVar4 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
        pAVar14 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
        if ((pAVar14->field_6).pTemp == (void *)0x0) {
          Abc_NtkDupObj(pNtk_00,pAVar14,1);
        }
        Abc_ObjAddFanin(*(Abc_Obj_t **)
                         ((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x40),
                        (pAVar14->field_6).pCopy);
        lVar18 = extraout_RDX_02;
      }
      lVar20 = lVar20 + 1;
      pVVar17 = pNtk->vBoxes;
    } while (lVar20 < pVVar17->nSize);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar8 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar8 + 500;
    iVar19 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar19) {
      piVar11 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar11;
      if (piVar11 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar19;
      lVar18 = extraout_RDX_03;
    }
    if (-500 < iVar8) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      lVar18 = extraout_RDX_04;
    }
    (pNtk->vTravIds).nSize = iVar19;
  }
  iVar8 = pNtk->nTravIds;
  pNtk->nTravIds = iVar8 + 1;
  if (0x3ffffffe < iVar8) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar17 = pNtk->vCis;
  if (0 < pVVar17->nSize) {
    lVar18 = 0;
    do {
      pAVar3 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar17->pArray[lVar18] + 0x20) + 8) +
                (long)**(int **)((long)pVVar17->pArray[lVar18] + 0x30) * 8);
      pVVar17 = pAVar3->pNtk->vAttrs;
      if (pVVar17->nSize < 0xd) goto LAB_008360b9;
      uVar22 = 2;
      lVar20 = lVar18;
      if ((pVVar17->pArray[0xc] != (void *)0x0) &&
         (pvVar12 = Abc_ObjMvVar(pAVar3), lVar20 = extraout_RDX_05, pvVar12 != (void *)0x0)) {
        puVar13 = (uint *)Abc_ObjMvVar(pAVar3);
        uVar22 = *puVar13;
        lVar20 = extraout_RDX_06;
      }
      iVar8 = (int)lVar20;
      uVar7 = uVar22;
      if (1 < uVar22) {
        uVar7 = uVar22 - 1;
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar21 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> uVar21 == 0; uVar21 = uVar21 - 1) {
            }
          }
          uVar7 = (uVar21 ^ 0xffffffe0) + 0x21;
        }
      }
      if (uVar7 != 0) {
        uVar21 = 0;
        do {
          pAVar14 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
          pcVar9 = Abc_SopEncoderLog((Mem_Flex_t *)pNtk_00->pManFunc,uVar21,uVar22);
          (pAVar14->field_5).pData = pcVar9;
          pAVar15 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NET);
          pAVar16 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BI);
          Abc_ObjAddFanin(pAVar14,(pAVar3->field_6).pCopy);
          Abc_ObjAddFanin(pAVar15,pAVar14);
          Abc_ObjAddFanin(pAVar16,pAVar15);
          Abc_ObjAddFanin(pAVar10,pAVar16);
          uVar21 = uVar21 + 1;
          iVar8 = extraout_EDX;
        } while (uVar7 != uVar21);
      }
      pAVar5 = pAVar3->pNtk;
      iVar19 = pAVar5->nTravIds;
      iVar2 = pAVar3->Id;
      Vec_IntFillExtra(&pAVar5->vTravIds,iVar2 + 1,iVar8);
      if (((long)iVar2 < 0) || ((pAVar5->vTravIds).nSize <= iVar2)) goto LAB_0083607b;
      (pAVar5->vTravIds).pArray[iVar2] = iVar19;
      lVar18 = lVar18 + 1;
      pVVar17 = pNtk->vCis;
    } while (lVar18 < pVVar17->nSize);
  }
  pVVar17 = pNtk->vCos;
  if (0 < pVVar17->nSize) {
    lVar20 = 0;
    do {
      pAVar3 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar17->pArray[lVar20] + 0x20) + 8) +
                (long)**(int **)((long)pVVar17->pArray[lVar20] + 0x20) * 8);
      pAVar5 = pAVar3->pNtk;
      iVar8 = pAVar3->Id;
      Vec_IntFillExtra(&pAVar5->vTravIds,iVar8 + 1,(int)lVar18);
      if (((long)iVar8 < 0) || ((pAVar5->vTravIds).nSize <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pAVar6 = pAVar3->pNtk;
      iVar19 = pAVar6->nTravIds;
      lVar18 = extraout_RDX_07;
      if ((pAVar5->vTravIds).pArray[iVar8] != iVar19) {
        iVar8 = pAVar3->Id;
        Vec_IntFillExtra(&pAVar6->vTravIds,iVar8 + 1,(int)extraout_RDX_07);
        if (((long)iVar8 < 0) || ((pAVar6->vTravIds).nSize <= iVar8)) {
LAB_0083607b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar6->vTravIds).pArray[iVar8] = iVar19;
        pVVar17 = pAVar3->pNtk->vAttrs;
        if (pVVar17->nSize < 0xd) goto LAB_008360b9;
        uVar22 = 2;
        if ((pVVar17->pArray[0xc] != (void *)0x0) &&
           (pvVar12 = Abc_ObjMvVar(pAVar3), pvVar12 != (void *)0x0)) {
          puVar13 = (uint *)Abc_ObjMvVar(pAVar3);
          uVar22 = *puVar13;
        }
        uVar7 = uVar22;
        if (1 < uVar22) {
          uVar7 = uVar22 - 1;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar21 = 0x1f;
            if (uVar7 != 0) {
              for (; uVar7 >> uVar21 == 0; uVar21 = uVar21 - 1) {
              }
            }
            uVar7 = (uVar21 ^ 0xffffffe0) + 0x21;
          }
        }
        pAVar14 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        pcVar9 = Abc_SopDecoderLog((Mem_Flex_t *)pNtk_00->pManFunc,uVar22);
        (pAVar14->field_5).pData = pcVar9;
        for (; uVar7 != 0; uVar7 = uVar7 - 1) {
          pAVar15 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BO);
          pAVar16 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NET);
          Abc_ObjAddFanin(pAVar15,pAVar10);
          Abc_ObjAddFanin(pAVar16,pAVar15);
          Abc_ObjAddFanin(pAVar14,pAVar16);
        }
        Abc_ObjAddFanin((pAVar3->field_6).pCopy,pAVar14);
        lVar18 = extraout_RDX_08;
      }
      lVar20 = lVar20 + 1;
      pVVar17 = pNtk->vCos;
    } while (lVar20 < pVVar17->nSize);
  }
  if (pNtk->ntkFunc == ABC_FUNC_BLIFMV) {
    if (pNtk->vAttrs->nSize < 0xd) {
LAB_008360b9:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (pNtk->vAttrs->pArray[0xc] != (void *)0x0) {
      if (pNtk_00->vAttrs->nSize < 0xd) goto LAB_008360b9;
      if (pNtk_00->vAttrs->pArray[0xc] == (void *)0x0) {
        Abc_NtkStartMvVars(pNtk_00);
      }
      pVVar17 = pNtk->vObjs;
      if (0 < pVVar17->nSize) {
        lVar18 = 0;
        do {
          pAVar10 = (Abc_Obj_t *)pVVar17->pArray[lVar18];
          if (((pAVar10 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar10->field_0x14 & 0xf) == 6)) &&
             (pAVar3 = (pAVar10->field_6).pCopy, pAVar3 != (Abc_Obj_t *)0x0)) {
            pVVar17 = pAVar10->pNtk->vAttrs;
            if (pVVar17->nSize < 0xd) goto LAB_008360b9;
            iVar8 = 2;
            if ((pVVar17->pArray[0xc] != (void *)0x0) &&
               (pvVar12 = Abc_ObjMvVar(pAVar10), pvVar12 != (void *)0x0)) {
              piVar11 = (int *)Abc_ObjMvVar(pAVar10);
              iVar8 = *piVar11;
            }
            Abc_NtkSetMvVarValues(pAVar3,iVar8);
          }
          lVar18 = lVar18 + 1;
          pVVar17 = pNtk->vObjs;
        } while (lVar18 < pVVar17->nSize);
      }
    }
  }
  iVar8 = Abc_NtkCheck(pNtk_00);
  if (iVar8 == 0) {
    fwrite("Abc_NtkSkeletonBlifMv(): Network check has failed.\n",0x33,1,_stdout);
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkSkeletonBlifMv( Abc_Ntk_t * pNtk )
{
    int fUsePositional = 0;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNet, * pNetNew, * pNodeNew, * pTermNew, * pBoxNew;
    int i, k, v, nValues, nBits;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pName );
    // create the internal box (it is important to put it first!)
    pBoxNew = Abc_NtkCreateWhitebox( pNtkNew );
    // create PIs and their nets
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pNet = Abc_ObjFanout0(pObj);
        Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pNet->pCopy, pObj->pCopy );
    }
    // create POs and their nets
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pNet = Abc_ObjFanin0(pObj);
        if ( pNet->pCopy == NULL )
            Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pObj->pCopy, pNet->pCopy );
    }
    // create latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
        // latch outputs
        pNet = Abc_ObjFanout0(Abc_ObjFanout0(pObj));
        assert( pNet->pCopy == NULL );
        Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pNet->pCopy, Abc_ObjFanout0(pObj)->pCopy );
        // latch inputs
        pNet = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        if ( pNet->pCopy == NULL )
            Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( Abc_ObjFanin0(pObj)->pCopy, pNet->pCopy );
    }

    // encode the CI nets
    Abc_NtkIncrementTravId( pNtk );
    if ( fUsePositional )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            for ( v = 0; v < nValues; v++ )
            {
                pNodeNew = Abc_NtkCreateNode( pNtkNew );
                pNodeNew->pData = Abc_SopEncoderPos( (Mem_Flex_t *)pNtkNew->pManFunc, v, nValues );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                pTermNew = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pNodeNew, pNet->pCopy );
                Abc_ObjAddFanin( pNetNew, pNodeNew );
                Abc_ObjAddFanin( pTermNew, pNetNew );
                Abc_ObjAddFanin( pBoxNew, pTermNew );
            }
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pNodeNew = Abc_NtkCreateNode( pNtkNew );
                pNodeNew->pData = Abc_SopEncoderLog( (Mem_Flex_t *)pNtkNew->pManFunc, k, nValues );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                pTermNew = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pNodeNew, pNet->pCopy );
                Abc_ObjAddFanin( pNetNew, pNodeNew );
                Abc_ObjAddFanin( pTermNew, pNetNew );
                Abc_ObjAddFanin( pBoxNew, pTermNew );
            }
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }

    // encode the CO nets
    if ( fUsePositional )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
            if ( Abc_NodeIsTravIdCurrent(pNet) )
                continue;
            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopDecoderPos( (Mem_Flex_t *)pNtkNew->pManFunc, nValues );
            for ( v = 0; v < nValues; v++ )
            {
                pTermNew = Abc_NtkCreateBo( pNtkNew );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                Abc_ObjAddFanin( pTermNew, pBoxNew );
                Abc_ObjAddFanin( pNetNew, pTermNew );
                Abc_ObjAddFanin( pNodeNew, pNetNew );
            }
            Abc_ObjAddFanin( pNet->pCopy, pNodeNew );
        }
    }
    else
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
            if ( Abc_NodeIsTravIdCurrent(pNet) )
                continue;
            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            nBits = Abc_Base2Log( nValues );
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopDecoderLog( (Mem_Flex_t *)pNtkNew->pManFunc, nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pTermNew = Abc_NtkCreateBo( pNtkNew );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                Abc_ObjAddFanin( pTermNew, pBoxNew );
                Abc_ObjAddFanin( pNetNew, pTermNew );
                Abc_ObjAddFanin( pNodeNew, pNetNew );
            }
            Abc_ObjAddFanin( pNet->pCopy, pNodeNew );
        }
    }

    // if it is a BLIF-MV netlist transfer the values of all nets
    if ( Abc_NtkHasBlifMv(pNtk) && Abc_NtkMvVar(pNtk) )
    {
        if ( Abc_NtkMvVar( pNtkNew ) == NULL )
            Abc_NtkStartMvVars( pNtkNew );
        Abc_NtkForEachNet( pNtk, pObj, i )
            if ( pObj->pCopy )
                Abc_NtkSetMvVarValues( pObj->pCopy, Abc_ObjMvVarNum(pObj) );
    }

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkSkeletonBlifMv(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}